

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.h
# Opt level: O2

void __thiscall
CTcHashEntryPpSpecial::CTcHashEntryPpSpecial
          (CTcHashEntryPpSpecial *this,CTcTokenizer *tok,char *str)

{
  size_t len;
  
  len = strlen(str);
  CTcHashEntryPp::CTcHashEntryPp(&this->super_CTcHashEntryPp,str,len,0);
  (this->super_CTcHashEntryPp).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry =
       (_func_int **)&PTR__CVmHashEntry_00316a10;
  this->tok_ = tok;
  return;
}

Assistant:

CTcHashEntryPpSpecial(CTcTokenizer *tok, const char *str)
        : CTcHashEntryPp(str, strlen(str), FALSE)
    {
        /* remember my tokenizer */
        tok_ = tok;
    }